

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util_test.cc
# Opt level: O1

string * google::protobuf::util::anon_unknown_0::
         GetTypeUrl<proto2_unittest::TestAllTypes_RepeatedGroup>(void)

{
  string *in_RDI;
  AlphaNum *in_R8;
  Metadata MVar1;
  AlphaNum local_98;
  AlphaNum local_68;
  undefined8 local_38;
  char *local_30;
  
  MVar1 = proto2_unittest::TestAllTypes_RepeatedGroup::GetMetadata
                    ((TestAllTypes_RepeatedGroup *)
                     proto2_unittest::_TestAllTypes_RepeatedGroup_default_instance_);
  local_98.piece_._M_str = ((MVar1.descriptor)->all_names_).payload_;
  local_98.piece_._M_len = (size_t)*(ushort *)(local_98.piece_._M_str + 2);
  local_98.piece_._M_str = local_98.piece_._M_str + ~local_98.piece_._M_len;
  local_38 = 0x13;
  local_30 = "type.googleapis.com";
  local_68.piece_._M_len = 1;
  local_68.piece_._M_str = "/";
  absl::lts_20250127::StrCat_abi_cxx11_(in_RDI,(lts_20250127 *)&local_38,&local_68,&local_98,in_R8);
  return in_RDI;
}

Assistant:

std::string GetTypeUrl() {
  return GetTypeUrl(T::descriptor()->full_name());
}